

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O2

uint TTA::Merge(uint u,uint v)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  puVar4 = next_;
  puVar3 = rtable_;
  uVar1 = rtable_[u];
  uVar2 = rtable_[v];
  uVar7 = uVar2;
  if (uVar1 < uVar2) {
    for (; uVar5 = uVar2, uVar6 = uVar1, uVar7 != 0xffffffff; uVar7 = puVar4[uVar7]) {
      puVar3[uVar7] = uVar1;
    }
  }
  else {
    uVar7 = uVar1;
    if (uVar1 <= uVar2) {
      return uVar1;
    }
    for (; uVar5 = uVar1, uVar6 = uVar2, uVar7 != 0xffffffff; uVar7 = puVar4[uVar7]) {
      puVar3[uVar7] = uVar2;
    }
  }
  puVar3 = tail_;
  next_[tail_[uVar6]] = uVar5;
  puVar3[uVar6] = puVar3[uVar5];
  return uVar6;
}

Assistant:

static unsigned Merge(unsigned u, unsigned v)
    {
        // FindRoot(u);
        u = rtable_[u];
        // FindRoot(v);
        v = rtable_[v];

        if (u < v) {
            unsigned i = v;
            while (i != UINT_MAX) {
                rtable_[i] = u;
                i = next_[i];
            }
            next_[tail_[u]] = v;
            tail_[u] = tail_[v];
            return u;
        }
        else if (u > v) {
            unsigned i = u;
            while (i != UINT_MAX) {
                rtable_[i] = v;
                i = next_[i];
            }
            next_[tail_[v]] = u;
            tail_[v] = tail_[u];
            return v;
        }

        return u;  // equal to v
    }